

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

void __thiscall rsg::AssignOp::tokenize(AssignOp *this,GeneratorState *state,TokenStream *str)

{
  pointer pTVar1;
  size_t sVar2;
  size_t sVar3;
  Token local_28;
  
  (*this->m_lvalueExpr->_vptr_Expression[3])();
  local_28.m_type = EQUAL;
  pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar1 >> 4;
  sVar3 = str->m_numTokens;
  if (sVar2 == sVar3) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x40);
    pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = str->m_numTokens;
  }
  Token::operator=(pTVar1 + sVar3,&local_28);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_28);
  (*this->m_rvalueExpr->_vptr_Expression[3])(this->m_rvalueExpr,state,str);
  return;
}

Assistant:

void AssignOp::tokenize (GeneratorState& state, TokenStream& str) const
{
	m_lvalueExpr->tokenize(state, str);
	str << Token::EQUAL;
	m_rvalueExpr->tokenize(state, str);
}